

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

bool __thiscall
VarTable::cInsert(VarTable *this,TypeNode *type,char *lexeme,bool pointer,int arraySize,
                 bool parameter,int size)

{
  int iVar1;
  VarSymbol *pVVar2;
  
  pVVar2 = cSearch(this,lexeme);
  if (((pVVar2 != (VarSymbol *)0x0) &&
      ((this->super_SymbolTable).currentScope <= (pVVar2->super_Symbol).scope)) &&
     (iVar1 = strcmp((pVVar2->super_Symbol).lexemeScope,(this->super_SymbolTable).currentScopeLexeme
                    ), iVar1 == 0)) {
    return false;
  }
  pVVar2 = (VarSymbol *)operator_new(0x48);
  VarSymbol::VarSymbol
            (pVVar2,0,(this->super_SymbolTable).currentScope,
             (this->super_SymbolTable).currentScopeLexeme,type,pointer,arraySize,parameter);
  pVVar2->size = size;
  SymbolTable::cInsert(&this->super_SymbolTable,(Symbol *)pVVar2,lexeme);
  return true;
}

Assistant:

bool VarTable::cInsert(TypeNode *type, const char *lexeme, bool pointer, int arraySize, bool parameter, int size) {
    VarSymbol *varSymbol = cSearch(lexeme);

    if (varSymbol == NULL || varSymbol->getScope() < currentScope || !varSymbol->isScope(currentScopeLexeme)) {
        varSymbol = new VarSymbol(0, currentScope, currentScopeLexeme, type, pointer, arraySize, parameter);
        varSymbol->setSize(size);
        SymbolTable::cInsert(varSymbol,
                             lexeme);
        return true;
    }
    return false;
}